

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

void __thiscall n_e_s::core::Ppu::Ppu(Ppu *this,PpuRegisters *registers,IMmu *mmu)

{
  uint8_t *local_30;
  anon_class_1_0_00000001 local_21;
  IMmu *local_20;
  IMmu *mmu_local;
  PpuRegisters *registers_local;
  Ppu *this_local;
  
  local_20 = mmu;
  mmu_local = (IMmu *)registers;
  registers_local = (PpuRegisters *)this;
  IPpu::IPpu(&this->super_IPpu);
  (this->super_IPpu)._vptr_IPpu = (_func_int **)&PTR__Ppu_001a7980;
  this->registers_ = (PpuRegisters *)mmu_local;
  this->mmu_ = local_20;
  std::function<void()>::function<n_e_s::core::Ppu::on_nmi_::_lambda()_1_,void>
            ((function<void()> *)&this->on_nmi_,&local_21);
  this->read_buffer_ = '\0';
  local_30 = this->oam_data_;
  do {
    *local_30 = '\0';
    local_30 = local_30 + 1;
  } while (local_30 != &this->field_0x139);
  return;
}

Assistant:

Ppu::Ppu(PpuRegisters *registers, IMmu *mmu)
        : registers_(registers), mmu_(mmu) {}